

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<float> * __thiscall
qclab::dense::SquareMatrix<float>::operator+=(SquareMatrix<float> *this,SquareMatrix<float> *rhs)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar1 = rhs->size_;
  if (lVar1 == this->size_) {
    lVar4 = 0;
    lVar5 = 0;
    if (0 < lVar1) {
      lVar5 = lVar1;
    }
    for (lVar7 = 0; lVar7 != lVar5; lVar7 = lVar7 + 1) {
      pfVar2 = (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      pfVar3 = (rhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      for (lVar6 = 0; lVar1 != lVar6; lVar6 = lVar6 + 1) {
        *(float *)((long)pfVar2 + lVar6 * 4 + lVar4) =
             *(float *)((long)pfVar3 + lVar6 * 4 + lVar4) +
             *(float *)((long)pfVar2 + lVar6 * 4 + lVar4);
      }
      lVar4 = lVar4 + lVar1 * 4;
    }
    return this;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0x98,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<float>::operator+=(const SquareMatrix<T> &) [T = float]"
               );
}

Assistant:

inline int64_t rows() const { return size_ ; }